

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::EnableTracingRequest::ParseFromArray
          (EnableTracingRequest *this,void *raw,size_t size)

{
  byte bVar1;
  _Head_base<0UL,_perfetto::protos::gen::TraceConfig_*,_false> _Var2;
  bool bVar3;
  short sVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong *puVar8;
  uint8_t cur_byte_2;
  ulong uVar9;
  uint8_t cur_byte_3;
  ulong *puVar10;
  uint8_t cur_byte;
  ulong uVar11;
  uint8_t cur_byte_1;
  ulong *puVar12;
  Field local_40;
  
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar8 = (ulong *)(size + (long)raw);
  do {
    if (puVar8 <= raw) goto switchD_00251e3e_caseD_3;
    bVar1 = (byte)*raw;
    uVar7 = (ulong)bVar1;
    puVar10 = (ulong *)((long)raw + 1);
    if ((char)bVar1 < '\0') {
      uVar7 = (ulong)(bVar1 & 0x7f);
      lVar6 = 7;
      do {
        if ((puVar8 <= puVar10) || (0x38 < lVar6 - 7U)) goto switchD_00251e3e_caseD_3;
        uVar5 = *puVar10;
        puVar10 = (ulong *)((long)puVar10 + 1);
        uVar7 = uVar7 | (ulong)((byte)uVar5 & 0x7f) << ((byte)lVar6 & 0x3f);
        lVar6 = lVar6 + 7;
      } while ((char)(byte)uVar5 < '\0');
    }
    uVar5 = uVar7 >> 3;
    if (((uint)uVar5 == 0) || (puVar8 <= puVar10)) goto switchD_00251e3e_caseD_3;
    switch((uint)uVar7 & 7) {
    case 0:
      uVar9 = 0;
      uVar11 = 0;
      while( true ) {
        puVar12 = (ulong *)((long)puVar10 + 1);
        uVar9 = (ulong)((byte)*puVar10 & 0x7f) << ((byte)uVar11 & 0x3f) | uVar9;
        if (-1 < (char)(byte)*puVar10) break;
        if ((puVar8 <= puVar12) ||
           (bVar3 = 0x38 < uVar11, uVar11 = uVar11 + 7, puVar10 = puVar12, bVar3))
        goto switchD_00251e3e_caseD_3;
      }
      local_40.int_value_ = uVar9 & 0xffffffff00000000;
      break;
    case 1:
      puVar12 = puVar10 + 1;
      if (puVar8 < puVar12) goto switchD_00251e3e_caseD_3;
      uVar9 = *puVar10;
      local_40.int_value_ = uVar9 & 0xffffffff00000000;
      break;
    case 2:
      puVar10 = (ulong *)((long)puVar10 + 1);
      uVar11 = 0;
      uVar9 = 0;
      puVar12 = puVar10;
      while (uVar11 = (ulong)(*(byte *)((long)puVar12 + -1) & 0x7f) << ((byte)uVar9 & 0x3f) | uVar11
            , (char)*(byte *)((long)puVar12 + -1) < '\0') {
        if (puVar8 <= puVar12) goto switchD_00251e3e_caseD_3;
        puVar12 = (ulong *)((long)puVar12 + 1);
        puVar10 = (ulong *)((long)puVar10 + 1);
        bVar3 = 0x38 < uVar9;
        uVar9 = uVar9 + 7;
        if (bVar3) goto switchD_00251e3e_caseD_3;
      }
      if (uVar11 <= (ulong)((long)puVar8 - (long)puVar10)) {
        local_40.int_value_ = (ulong)puVar10 & 0xffffffff00000000;
        puVar12 = (ulong *)((long)puVar12 + uVar11);
        uVar9 = (ulong)puVar10 & 0xffffffff;
        goto LAB_00251f19;
      }
    default:
      goto switchD_00251e3e_caseD_3;
    case 5:
      puVar12 = (ulong *)((long)puVar10 + 4);
      if (puVar8 < puVar12) goto switchD_00251e3e_caseD_3;
      uVar9 = (ulong)(uint)*puVar10;
      local_40.int_value_ = 0;
    }
    uVar11 = 0;
LAB_00251f19:
    raw = puVar12;
  } while ((0xffff < (uint)uVar5) || (0xfffffff < uVar11));
  local_40.int_value_ = local_40.int_value_ | uVar9 & 0xffffffff;
  uVar9 = uVar5 << 0x20 | uVar11;
  uVar7 = uVar9 | (ulong)((uint)uVar7 & 7) << 0x30;
  local_40.size_ = (uint32_t)uVar11;
  local_40.type_ = (uint8_t)(uVar7 >> 0x30);
  local_40.id_ = (uint16_t)(uVar9 >> 0x20);
  sVar4 = (short)uVar5;
  while (sVar4 != 0) {
    if ((ushort)uVar5 < 3) {
      (this->_has_field_).super__Base_bitset<1UL>._M_w =
           (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar5 & 0x3f);
    }
    if ((ushort)uVar5 == 2) {
      this->attach_notification_only_ = local_40.int_value_ != 0;
    }
    else if (((uint)uVar5 & 0xffff) == 1) {
      _Var2._M_head_impl =
           (this->trace_config_).ptr_._M_t.
           super___uniq_ptr_impl<perfetto::protos::gen::TraceConfig,_std::default_delete<perfetto::protos::gen::TraceConfig>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::protos::gen::TraceConfig_*,_std::default_delete<perfetto::protos::gen::TraceConfig>_>
           .super__Head_base<0UL,_perfetto::protos::gen::TraceConfig_*,_false>._M_head_impl;
      (**(code **)(*(long *)&(_Var2._M_head_impl)->super_CppMessageObj + 0x20))
                (_Var2._M_head_impl,local_40.int_value_,uVar7 & 0xffffffff);
    }
    else {
      protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                (&local_40,&this->unknown_fields_);
    }
    do {
      if (puVar8 <= raw) goto switchD_00251e3e_caseD_3;
      bVar1 = (byte)*raw;
      uVar7 = (ulong)(uint)bVar1;
      puVar10 = (ulong *)((long)raw + 1);
      if ((char)bVar1 < '\0') {
        uVar7 = (ulong)(bVar1 & 0x7f);
        lVar6 = 7;
        do {
          if ((puVar8 <= puVar10) || (0x38 < lVar6 - 7U)) goto switchD_00251e3e_caseD_3;
          uVar5 = *puVar10;
          puVar10 = (ulong *)((long)puVar10 + 1);
          uVar7 = uVar7 | (ulong)((byte)uVar5 & 0x7f) << ((byte)lVar6 & 0x3f);
          lVar6 = lVar6 + 7;
        } while ((char)(byte)uVar5 < '\0');
      }
      uVar5 = uVar7 >> 3;
      if (((uint)uVar5 == 0) || (puVar8 <= puVar10)) goto switchD_00251e3e_caseD_3;
      switch((uint)uVar7 & 7) {
      case 0:
        uVar9 = 0;
        uVar11 = 0;
        while( true ) {
          puVar12 = (ulong *)((long)puVar10 + 1);
          uVar9 = (ulong)((byte)*puVar10 & 0x7f) << ((byte)uVar11 & 0x3f) | uVar9;
          if (-1 < (char)(byte)*puVar10) break;
          if ((puVar8 <= puVar12) ||
             (bVar3 = 0x38 < uVar11, uVar11 = uVar11 + 7, puVar10 = puVar12, bVar3))
          goto switchD_00251e3e_caseD_3;
        }
        local_40.int_value_ = uVar9 & 0xffffffff00000000;
        break;
      case 1:
        puVar12 = puVar10 + 1;
        if (puVar8 < puVar12) goto switchD_00251e3e_caseD_3;
        uVar9 = *puVar10;
        local_40.int_value_ = uVar9 & 0xffffffff00000000;
        break;
      case 2:
        puVar10 = (ulong *)((long)puVar10 + 1);
        uVar11 = 0;
        uVar9 = 0;
        puVar12 = puVar10;
        while (uVar11 = (ulong)(*(byte *)((long)puVar12 + -1) & 0x7f) << ((byte)uVar9 & 0x3f) |
                        uVar11, (char)*(byte *)((long)puVar12 + -1) < '\0') {
          if (puVar8 <= puVar12) goto switchD_00251e3e_caseD_3;
          puVar12 = (ulong *)((long)puVar12 + 1);
          puVar10 = (ulong *)((long)puVar10 + 1);
          bVar3 = 0x38 < uVar9;
          uVar9 = uVar9 + 7;
          if (bVar3) goto switchD_00251e3e_caseD_3;
        }
        if (uVar11 <= (ulong)((long)puVar8 - (long)puVar10)) {
          local_40.int_value_ = (ulong)puVar10 & 0xffffffff00000000;
          puVar12 = (ulong *)((long)puVar12 + uVar11);
          uVar9 = (ulong)puVar10 & 0xffffffff;
          goto LAB_002521be;
        }
      default:
        goto switchD_00251e3e_caseD_3;
      case 5:
        puVar12 = (ulong *)((long)puVar10 + 4);
        if (puVar8 < puVar12) goto switchD_00251e3e_caseD_3;
        uVar9 = (ulong)(uint)*puVar10;
        local_40.int_value_ = 0;
      }
      uVar11 = 0;
LAB_002521be:
      raw = puVar12;
    } while ((0xffff < (uint)uVar5) || (0xfffffff < uVar11));
    local_40.int_value_ = local_40.int_value_ | uVar9 & 0xffffffff;
    uVar9 = uVar5 << 0x20 | uVar11;
    uVar7 = uVar9 | (uVar7 & 7) << 0x30;
    local_40.size_ = (uint32_t)uVar11;
    local_40.type_ = (uint8_t)(uVar7 >> 0x30);
    local_40.id_ = (uint16_t)(uVar9 >> 0x20);
    sVar4 = (short)uVar5;
  }
switchD_00251e3e_caseD_3:
  return puVar8 == (ulong *)raw;
}

Assistant:

bool EnableTracingRequest::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* trace_config */:
        (*trace_config_).ParseFromArray(field.data(), field.size());
        break;
      case 2 /* attach_notification_only */:
        field.get(&attach_notification_only_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}